

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_named_parameters.cpp
# Opt level: O2

void duckdb::Binder::BindNamedParameters
               (named_parameter_type_map_t *types,named_parameter_map_t *values,
               QueryErrorContext *error_context,string *func_name)

{
  QueryErrorContext error_context_00;
  iterator iVar1;
  _Base_ptr p_Var2;
  BinderException *this;
  __node_base *p_Var3;
  allocator local_141;
  string *local_140;
  QueryErrorContext *local_138;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string named_params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ordered_params;
  
  p_Var3 = &(values->_M_h)._M_before_begin;
  while( true ) {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      return;
    }
    iVar1 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&types->_M_h,(key_type *)(p_Var3 + 1));
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ._M_cur == (__node_type *)0x0) break;
    if (*(char *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                        ._M_cur + 0x28) != '\x03') {
      Value::DefaultCastAs
                ((Value *)&ordered_params,(Value *)(p_Var3 + 5),
                 (LogicalType *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                        ._M_cur + 0x28),false);
      Value::operator=((Value *)(p_Var3 + 5),(Value *)&ordered_params);
      Value::~Value((Value *)&ordered_params);
    }
  }
  local_140 = func_name;
  local_138 = error_context;
  order_case_insensitive_map<duckdb::LogicalType>(&ordered_params,types);
  named_params._M_dataplus._M_p = (pointer)&named_params.field_2;
  named_params._M_string_length = 0;
  named_params.field_2._M_local_buf[0] = '\0';
  for (p_Var2 = ordered_params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &ordered_params._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    ::std::__cxx11::string::append((char *)&named_params);
    ::std::__cxx11::string::append((string *)&named_params);
    ::std::__cxx11::string::append((char *)&named_params);
    LogicalType::ToString_abi_cxx11_(&error_msg,(LogicalType *)(p_Var2 + 2));
    ::std::__cxx11::string::append((string *)&named_params);
    ::std::__cxx11::string::~string((string *)&error_msg);
    ::std::__cxx11::string::append((char *)&named_params);
  }
  error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
  error_msg._M_string_length = 0;
  error_msg.field_2._M_local_buf[0] = '\0';
  if (named_params._M_string_length == 0) {
    ::std::__cxx11::string::assign((char *)&error_msg);
  }
  else {
    ::std::operator+(&local_110,"Candidates:\n",&named_params);
    ::std::__cxx11::string::operator=((string *)&error_msg,(string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  error_context_00.query_location.index = (optional_idx)(local_138->query_location).index;
  ::std::__cxx11::string::string
            ((string *)&local_110,"Invalid named parameter \"%s\" for function %s\n%s",&local_141);
  ::std::__cxx11::string::string((string *)&local_90,(string *)(p_Var3 + 1));
  ::std::__cxx11::string::string((string *)&local_b0,(string *)local_140);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)&error_msg);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,error_context_00,&local_110,&local_90,&local_b0,&local_d0);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::BindNamedParameters(named_parameter_type_map_t &types, named_parameter_map_t &values,
                                 QueryErrorContext &error_context, string &func_name) {
	for (auto &kv : values) {
		auto entry = types.find(kv.first);
		if (entry == types.end()) {
			auto ordered_params = order_case_insensitive_map(types);
			// create a list of named parameters for the error
			string named_params;
			for (auto &kv_ordered_params : ordered_params) {
				named_params += "    ";
				named_params += kv_ordered_params.first;
				named_params += " ";
				named_params += kv_ordered_params.second.ToString();
				named_params += "\n";
			}
			string error_msg;
			if (named_params.empty()) {
				error_msg = "Function does not accept any named parameters.";
			} else {
				error_msg = "Candidates:\n" + named_params;
			}
			throw BinderException(error_context, "Invalid named parameter \"%s\" for function %s\n%s", kv.first,
			                      func_name, error_msg);
		}
		if (entry->second.id() != LogicalTypeId::ANY) {
			kv.second = kv.second.DefaultCastAs(entry->second);
		}
	}
}